

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_diagnostics(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ostream *poVar2;
  char *__nptr;
  long lVar3;
  long *in_RSI;
  long *in_RDI;
  double dVar4;
  option_group_definition diagnostic_group;
  string progress_arg;
  bool help;
  bool version_arg;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff598;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5a0;
  string *in_stack_fffffffffffff5a8;
  byte local_a22;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5e8;
  allocator *paVar5;
  option_group_definition *in_stack_fffffffffffff5f0;
  allocator local_931;
  string local_930 [32];
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [359];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [359];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [359];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [359];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [375];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [38];
  undefined1 local_12;
  byte local_11;
  long *local_10;
  long *local_8;
  
  local_11 = 0;
  local_12 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Diagnostic options",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff5a0,
             (string *)in_stack_fffffffffffff598);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"version",&local_209);
  VW::config::make_option<bool>(in_stack_fffffffffffff5a8,(bool *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"Version information",&local_231);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,
             (typed_option<bool> *)in_stack_fffffffffffff598);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff5f0,(typed_option<bool> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"audit",&local_399);
  VW::config::make_option<bool>(in_stack_fffffffffffff5a8,(bool *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"a",&local_3c1);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"print weights of features",&local_3e9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,
             (typed_option<bool> *)in_stack_fffffffffffff598);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff5f0,(typed_option<bool> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"progress",&local_551);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff5a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"P",&local_579);
  this = VW::config::
         typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::short_name(in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5a0,"Progress update frequency. int: additive, float: multiplicative",&local_5a1)
  ;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"quiet",&local_709);
  VW::config::make_option<bool>(in_stack_fffffffffffff5a8,(bool *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_730,"Don\'t output disgnostics and progress updates",&local_731);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,
             (typed_option<bool> *)in_stack_fffffffffffff598);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff5f0,(typed_option<bool> *)in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_898,"help",&local_899);
  VW::config::make_option<bool>(in_stack_fffffffffffff5a8,(bool *)in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"h",&local_8c1);
  VW::config::typed_option<bool>::short_name
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_8e8,"Look here: http://hunch.net/~vw/ and click on Tutorial.",&local_8e9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,(string *)in_stack_fffffffffffff598);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff5a0,
             (typed_option<bool> *)in_stack_fffffffffffff598);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff5f0,(typed_option<bool> *)in_stack_fffffffffffff5e8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff5a0);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  (**(code **)*local_8)(local_8,local_70);
  if ((local_11 & 1) == 0) {
    paVar5 = &local_931;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_930,"progress",paVar5);
    bVar1 = (**(code **)(*local_8 + 8))(local_8,local_930);
    local_a22 = 0;
    if ((bVar1 & 1) != 0) {
      local_a22 = *(byte *)((long)local_10 + 0x3439) ^ 0xff;
    }
    std::__cxx11::string::~string(local_930);
    std::allocator<char>::~allocator((allocator<char> *)&local_931);
    if ((local_a22 & 1) != 0) {
      __nptr = (char *)std::__cxx11::string::c_str();
      dVar4 = atof(__nptr);
      *(float *)((long)local_10 + 0x361c) = (float)dVar4;
      lVar3 = std::__cxx11::string::find_first_of((char *)local_38,0x3e37a8);
      if (lVar3 == -1) {
        *(undefined1 *)((long)local_10 + 0x361a) = 1;
        if (*(float *)((long)local_10 + 0x361c) <= 1.0 && *(float *)((long)local_10 + 0x361c) != 1.0
           ) {
          poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),"warning: additive --progress <int>"
                                  );
          poVar2 = std::operator<<(poVar2," can\'t be < 1: forcing to 1");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          *(undefined4 *)((long)local_10 + 0x361c) = 0x3f800000;
        }
        *(undefined4 *)(*local_10 + 0x50) = *(undefined4 *)((long)local_10 + 0x361c);
      }
      else {
        *(undefined1 *)((long)local_10 + 0x361a) = 0;
        if (1.0 < *(float *)((long)local_10 + 0x361c)) {
          if (9.0 < *(float *)((long)local_10 + 0x361c)) {
            poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),
                                     "warning: multiplicative --progress <float>");
            in_stack_fffffffffffff5a0 =
                 (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::operator<<(poVar2," is > 9.0: you probably meant to use an integer");
            std::ostream::operator<<
                      (in_stack_fffffffffffff5a0,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)(local_10 + 0x1c),
                                   "warning: multiplicative --progress <float>: ");
          poVar2 = std::operator<<(poVar2,local_38);
          poVar2 = std::operator<<(poVar2," is <= 1.0: adding 1.0");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          *(float *)((long)local_10 + 0x361c) = *(float *)((long)local_10 + 0x361c) + 1.0;
        }
        *(undefined4 *)(*local_10 + 0x50) = 0x3f800000;
      }
    }
    VW::config::option_group_definition::~option_group_definition
              ((option_group_definition *)in_stack_fffffffffffff5a0);
    std::__cxx11::string::~string(local_38);
    return;
  }
  version_struct::to_string_abi_cxx11_((version_struct *)this);
  poVar2 = std::operator<<((ostream *)&std::cout,local_910);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_910);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}